

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysqlhs_connection.cpp
# Opt level: O2

int64_t __thiscall mysqlhs::connection::affected_rows(connection *this)

{
  longlong lVar1;
  char *local_38 [4];
  
  lVar1 = -1;
  if ((0xfffffffd < this->query_type_ + ~delete_) && ((this->raw_data_)._M_string_length != 0)) {
    std::__cxx11::string::find_last_of((char *)&this->raw_data_,0x1091f3);
    std::__cxx11::string::substr((ulong)local_38,(ulong)&this->raw_data_);
    lVar1 = strtoll(local_38[0],(char **)0x0,0);
    std::__cxx11::string::~string((string *)local_38);
  }
  return lVar1;
}

Assistant:

int64_t connection::affected_rows()
	{
		if (query_type_ != query_type::update_ && query_type_ != query_type::delete_)
		{
			return -1;
		}

		if (raw_data_.size() < 1)
		{
			return -1;
		}

		auto found = raw_data_.find_last_of("\t");
		return strtoll(raw_data_.substr(found + 1).c_str(), nullptr, 0);
	}